

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O3

void __thiscall
jaegertracing::Span::SetBaggageItem(Span *this,string_view restrictedKey,string_view value)

{
  element_type *peVar1;
  RestrictionManager *pRVar2;
  _Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
  _Var3;
  int iVar4;
  uint uVar5;
  int extraout_var;
  iterator iVar6;
  mapped_type *pmVar7;
  __alloc_node_gen_t __alloc_node_gen;
  StrMap baggage;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  _Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  string local_160;
  undefined1 local_140 [40];
  Span local_118;
  element_type *local_110;
  __node_base local_108;
  SpanContext local_100;
  __buckets_ptr local_f8;
  size_t sStack_f0;
  __node_base local_e8;
  undefined **local_e0;
  undefined8 local_78;
  
  local_140._32_8_ = &this->_mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)local_140._32_8_);
  if (iVar4 == 0) {
    peVar1 = (this->_tracer).
             super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var8._M_h = (__hashtable_alloc *)&stack0xfffffffffffffee8;
    local_118._vptr_Span = (_func_int **)0x0;
    local_110 = (element_type *)(this->_context)._baggage._M_h._M_bucket_count;
    local_108._M_nxt = (_Hash_node_base *)0x0;
    local_100._vptr_SpanContext = (_func_int **)(this->_context)._baggage._M_h._M_element_count;
    local_f8 = *(__buckets_ptr *)&(this->_context)._baggage._M_h._M_rehash_policy;
    sStack_f0 = (this->_context)._baggage._M_h._M_rehash_policy._M_next_resize;
    local_e8._M_nxt = (__node_base_ptr)0x0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)_Var8._M_h,&(this->_context)._baggage._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                *)&stack0xfffffffffffffe80);
    local_140._0_8_ = local_140 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_140,restrictedKey.data_,restrictedKey.data_ + restrictedKey.length_);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,value.data_,value.data_ + value.length_);
    pRVar2 = (peVar1->_baggageSetter)._restrictionManager;
    serviceNameNoLock_abi_cxx11_((string *)&stack0xfffffffffffffe80,this);
    uVar5 = (*pRVar2->_vptr_RestrictionManager[2])
                      (pRVar2,(string *)&stack0xfffffffffffffe80,local_140);
    if ((Span *)_Var8._M_h != (Span *)&local_170) {
      operator_delete(_Var8._M_h);
    }
    if ((uVar5 & 1) == 0) {
      local_170._M_local_buf[0] = '\0';
      _Var8._M_h = (__hashtable_alloc *)&local_170;
      jaegertracing::baggage::BaggageSetter::
      logFields<jaegertracing::Span::SetBaggageItem(opentracing::v3::string_view,opentracing::v3::string_view)::__0>
                ((BaggageSetter *)(ulong)*(uint *)&(this->_context)._flags,(Span *)local_140,
                 &local_160,(string *)&stack0xfffffffffffffe80,(string *)0x0,false,SUB81(this,0),
                 (Span *)&local_170);
      if ((Span *)_Var8._M_h != (Span *)&local_170) {
        operator_delete(_Var8._M_h);
      }
      _Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
           (((peVar1->_baggageSetter)._metrics)->_baggageUpdateFailure)._M_t.
           super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
           .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
      (**(code **)(*(long *)_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                            _M_head_impl + 0x10))
                (_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,
                 1);
    }
    else {
      if (extraout_var < (int)local_160._M_string_length) {
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffe80,(ulong)&local_160);
        std::__cxx11::string::operator=((string *)&local_160,(string *)&stack0xfffffffffffffe80);
        if ((Span *)_Var8._M_h != (Span *)&local_170) {
          operator_delete(_Var8._M_h);
        }
        _Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
             (((peVar1->_baggageSetter)._metrics)->_baggageTruncate)._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
        (**(code **)(*(long *)_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                              _M_head_impl + 0x10))
                  (_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                   _M_head_impl,1);
      }
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&stack0xfffffffffffffee8,(key_type *)local_140);
      _Var8._M_h = (__hashtable_alloc *)&local_170;
      if (iVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_170._M_local_buf[0] = '\0';
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&stack0xfffffffffffffee8,(key_type *)local_140);
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xfffffffffffffe80,
                   *(long *)((long)iVar6.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur + 0x28),
                   *(long *)((long)iVar6.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur + 0x30) +
                   *(long *)((long)iVar6.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur + 0x28));
        pmVar7 = (mapped_type *)
                 ((long)iVar6.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28);
      }
      std::__cxx11::string::_M_assign((string *)pmVar7);
      jaegertracing::baggage::BaggageSetter::
      logFields<jaegertracing::Span::SetBaggageItem(opentracing::v3::string_view,opentracing::v3::string_view)::__0>
                ((BaggageSetter *)(ulong)*(uint *)&(this->_context)._flags,(Span *)local_140,
                 &local_160,(string *)&stack0xfffffffffffffe80,
                 (string *)(ulong)(extraout_var < (int)local_160._M_string_length),true,
                 SUB81(this,0),(anon_class_8_1_8991fb9c)_Var8._M_h);
      _Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
           (((peVar1->_baggageSetter)._metrics)->_baggageUpdateSuccess)._M_t.
           super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
           .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
      (**(code **)(*(long *)_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                            _M_head_impl + 0x10))
                (_Var3.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,
                 1);
      if ((Span *)_Var8._M_h != (Span *)&local_170) {
        operator_delete(_Var8._M_h);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_);
    }
    SpanContext::withBaggage
              ((SpanContext *)&stack0xffffffffffffff20,&this->_context,
               (StrMap *)&stack0xfffffffffffffee8);
    SpanContext::swap(&this->_context,(SpanContext *)&stack0xffffffffffffff20);
    local_e0 = &PTR__SpanContext_00264a78;
    if ((undefined1 *)local_78 != &stack0xffffffffffffff98) {
      operator_delete((void *)local_78);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&stack0xffffffffffffff50);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&stack0xfffffffffffffee8);
    pthread_mutex_unlock((pthread_mutex_t *)local_140._32_8_);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void Span::SetBaggageItem(opentracing::string_view restrictedKey,
                          opentracing::string_view value) noexcept
{
    std::lock_guard<std::mutex> lock(_mutex);
    const auto& baggageSetter = _tracer->baggageSetter();
    auto baggage = _context.baggage();
    baggageSetter.setBaggage(*this,
                             baggage,
                             restrictedKey,
                             value,
                             [this](std::vector<Tag>::const_iterator first,
                                    std::vector<Tag>::const_iterator last) {
                                 logFieldsNoLocking(SystemClock::now(), first, last);
                             });
    _context = _context.withBaggage(baggage);
}